

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O2

void __thiscall
ft::
vector<ft::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_ft::allocator<ft::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
::push_back(vector<ft::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_ft::allocator<ft::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            *this,value_type *val)

{
  ulong uVar1;
  size_t in_RDX;
  
  uVar1 = this->m_size;
  if (this->m_capacity <= uVar1) {
    realloc(this,(void *)(this->m_capacity * 2),in_RDX);
    uVar1 = this->m_size;
  }
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::pair
            (this->m_data + uVar1,val);
  this->m_size = this->m_size + 1;
  return;
}

Assistant:

void		push_back(value_type const & val) {
		if (this->size() >= this->capacity())
			this->realloc(this->capacity() * 2);
		this->get_allocator().construct(this->m_data + this->size(), val);
		++this->m_size;
	}